

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

int speex_resampler_process_native
              (SpeexResamplerState *st,uint channel_index,uint *in_len,spx_word16_t *out,
              uint *out_len)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 in_RCX;
  int *in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  uint ilen;
  spx_word16_t *mem;
  int out_sample;
  int N;
  int j;
  undefined4 local_2c;
  
  iVar1 = *(int *)(in_RDI + 0x18);
  lVar4 = *(long *)(in_RDI + 0x58) + (ulong)(in_ESI * *(int *)(in_RDI + 0x1c)) * 4;
  *(undefined4 *)(in_RDI + 0x38) = 1;
  uVar3 = (**(code **)(in_RDI + 0x70))(in_RDI,in_ESI,lVar4,in_RDX,in_RCX,in_R8);
  if (*(int *)(*(long *)(in_RDI + 0x40) + (ulong)in_ESI * 4) < *in_RDX) {
    *in_RDX = *(int *)(*(long *)(in_RDI + 0x40) + (ulong)in_ESI * 4);
  }
  *in_R8 = uVar3;
  *(int *)(*(long *)(in_RDI + 0x40) + (ulong)in_ESI * 4) =
       *(int *)(*(long *)(in_RDI + 0x40) + (ulong)in_ESI * 4) - *in_RDX;
  iVar2 = *in_RDX;
  for (local_2c = 0; local_2c < iVar1 + -1; local_2c = local_2c + 1) {
    *(undefined4 *)(lVar4 + (long)local_2c * 4) =
         *(undefined4 *)(lVar4 + (ulong)(uint)(local_2c + iVar2) * 4);
  }
  return 0;
}

Assistant:

static int speex_resampler_process_native(SpeexResamplerState *st, spx_uint32_t channel_index, spx_uint32_t *in_len, spx_word16_t *out, spx_uint32_t *out_len)
{
   int j=0;
   const int N = st->filt_len;
   int out_sample = 0;
   spx_word16_t *mem = st->mem + channel_index * st->mem_alloc_size;
   spx_uint32_t ilen;

   st->started = 1;

   /* Call the right resampler through the function ptr */
   out_sample = st->resampler_ptr(st, channel_index, mem, in_len, out, out_len);

   if (st->last_sample[channel_index] < (spx_int32_t)*in_len)
      *in_len = st->last_sample[channel_index];
   *out_len = out_sample;
   st->last_sample[channel_index] -= *in_len;

   ilen = *in_len;

   for(j=0;j<N-1;++j)
     mem[j] = mem[j+ilen];

   return RESAMPLER_ERR_SUCCESS;
}